

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O3

void ELFIO::dump::header(ostream *out,elfio *reader)

{
  elf_header *peVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  ostream *poVar5;
  uint *in_RCX;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_3c [4];
  string local_38;
  
  peVar1 = (reader->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if ((peVar1 != (elf_header *)0x0) && (iVar2 = (*peVar1->_vptr_elf_header[7])(), (short)iVar2 != 0)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"ELF Header",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Class:      ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_60._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      iVar2 = (*peVar1->_vptr_elf_header[4])();
      local_60._M_dataplus._M_p._0_1_ = (undefined1)iVar2;
    }
    format_assoc<ELFIO::class_table_t[2],unsigned_char>
              (&local_38,(dump *)class_table,(class_table_t (*) [2])&local_60,(uchar *)in_RCX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Encoding:   ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_80._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      iVar2 = (*peVar1->_vptr_elf_header[6])();
      local_80._M_dataplus._M_p._0_1_ = (undefined1)iVar2;
    }
    format_assoc<ELFIO::endian_table_t[3],unsigned_char>
              (&local_60,(dump *)endian_table,(endian_table_t (*) [3])&local_80,(uchar *)in_RCX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                local_60._M_dataplus._M_p._0_1_),
                        local_60._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ELFVersion: ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_a0._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      iVar2 = (*peVar1->_vptr_elf_header[5])();
      local_a0._M_dataplus._M_p._0_1_ = (undefined1)iVar2;
    }
    format_assoc<ELFIO::version_table_t[2],unsigned_char>
              (&local_80,(dump *)version_table,(version_table_t (*) [2])&local_a0,(uchar *)in_RCX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                                local_80._M_dataplus._M_p._0_1_),
                        local_80._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  OS/ABI:     ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_c0._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      iVar2 = (*peVar1->_vptr_elf_header[0xc])();
      local_c0._M_dataplus._M_p._0_1_ = (undefined1)iVar2;
    }
    format_assoc<ELFIO::os_abi_table_t[20],unsigned_char>
              (&local_a0,(dump *)os_abi_table,(os_abi_table_t (*) [20])&local_c0,(uchar *)in_RCX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                                local_a0._M_dataplus._M_p._0_1_),
                        local_a0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ABI Version:",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (*peVar1->_vptr_elf_header[0xe])();
    }
    plVar4 = (long *)std::ostream::operator<<((ostream *)poVar5,uVar3 & 0xff);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Type:       ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_e0._M_dataplus._M_p._0_2_ = 0;
    }
    else {
      iVar2 = (*peVar1->_vptr_elf_header[0x10])();
      local_e0._M_dataplus._M_p._0_2_ = (undefined2)iVar2;
    }
    format_assoc<ELFIO::type_table_t[5],unsigned_short>
              (&local_c0,(dump *)type_table,(type_table_t (*) [5])&local_e0,(unsigned_short *)in_RCX
              );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,
                                                local_c0._M_dataplus._M_p._0_1_),
                        local_c0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Machine:    ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_100._M_dataplus._M_p._0_2_ = 0;
    }
    else {
      iVar2 = (*peVar1->_vptr_elf_header[0x12])();
      local_100._M_dataplus._M_p._0_2_ = (undefined2)iVar2;
    }
    format_assoc<ELFIO::machine_table_t[256],unsigned_short>
              (&local_e0,(dump *)machine_table,(machine_table_t (*) [256])&local_100,
               (unsigned_short *)in_RCX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT62(local_e0._M_dataplus._M_p._2_6_,
                                                local_e0._M_dataplus._M_p._0_2_),
                        local_e0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Version:    ",0xe);
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      local_3c = (undefined1  [4])0x0;
    }
    else {
      local_3c = (undefined1  [4])(*peVar1->_vptr_elf_header[10])();
    }
    format_assoc<ELFIO::version_table_t[2],unsigned_int>
              (&local_100,(dump *)version_table,(version_table_t (*) [2])local_3c,in_RCX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT62(local_100._M_dataplus._M_p._2_6_,
                                                local_100._M_dataplus._M_p._0_2_),
                        local_100._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Entry:      ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0x16])();
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Flags:      ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0x14])();
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_100._M_dataplus._M_p._2_6_,local_100._M_dataplus._M_p._0_2_) !=
        &local_100.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_100._M_dataplus._M_p._2_6_,local_100._M_dataplus._M_p._0_2_),
                      local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_e0._M_dataplus._M_p._2_6_,local_e0._M_dataplus._M_p._0_2_) !=
        &local_e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_e0._M_dataplus._M_p._2_6_,local_e0._M_dataplus._M_p._0_2_),
                      local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,local_c0._M_dataplus._M_p._0_1_) !=
        &local_c0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_c0._M_dataplus._M_p._1_7_,local_c0._M_dataplus._M_p._0_1_),
                      local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_),
                      local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                      local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                      local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

static void header( std::ostream& out, const elfio& reader )
    {
        if ( !reader.get_header_size() ) {
            return;
        }
        out << "ELF Header" << std::endl
            << std::endl
            << "  Class:      " << str_class( reader.get_class() ) << std::endl
            << "  Encoding:   " << str_endian( reader.get_encoding() )
            << std::endl
            << "  ELFVersion: " << str_version( reader.get_elf_version() )
            << std::endl
            << "  OS/ABI:     " << str_os_abi( reader.get_os_abi() )
            << std::endl
            << "  ABI Version:" << (int)reader.get_abi_version() << std::endl
            << "  Type:       " << str_type( reader.get_type() ) << std::endl
            << "  Machine:    " << str_machine( reader.get_machine() )
            << std::endl
            << "  Version:    " << str_version( reader.get_version() )
            << std::endl
            << "  Entry:      " << "0x" << std::hex << reader.get_entry()
            << std::endl
            << "  Flags:      " << "0x" << std::hex << reader.get_flags()
            << std::endl
            << std::endl;
    }